

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O3

bool __thiscall
duckdb::TopNHeap::CheckBoundaryValues
          (TopNHeap *this,DataChunk *sort_chunk,DataChunk *payload,
          TopNBoundaryValue *global_boundary)

{
  ulong uVar1;
  DataChunk *this_00;
  DataChunk *this_01;
  SelectionVector *true_sel;
  SelectionVector *false_sel;
  Vector *pVVar2;
  vector<duckdb::BoundOrderByNode,_true> *this_02;
  pointer pBVar3;
  pointer pBVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  idx_t iVar9;
  idx_t count;
  Vector *col;
  Vector *this_03;
  size_type __n;
  pointer __src;
  vector<duckdb::OrderModifiers,_true> *in_R9;
  bool bVar10;
  string_t sort_key;
  string current_boundary_val;
  ulong local_a0;
  SelectionVector local_98;
  uint local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 local_6c;
  DataChunk *local_68;
  buffer_ptr<SelectionData> *local_60;
  optional_ptr<duckdb::SelectionVector,_true> local_58;
  string local_50;
  
  local_68 = payload;
  TopNBoundaryValue::GetBoundaryValue_abi_cxx11_(&local_50,global_boundary);
  if (local_50._M_string_length == 0) {
    bVar10 = true;
    goto LAB_0155d463;
  }
  if (local_50._M_string_length == (this->boundary_val)._M_string_length) {
    iVar5 = bcmp(local_50._M_dataplus._M_p,(this->boundary_val)._M_dataplus._M_p,
                 local_50._M_string_length);
    if (iVar5 != 0) goto LAB_0155d01a;
  }
  else {
LAB_0155d01a:
    ::std::__cxx11::string::operator=((string *)&this->boundary_val,(string *)&local_50);
    DataChunk::Reset(&this->boundary_values);
    __src = (this->boundary_val)._M_dataplus._M_p;
    local_78 = (uint)(this->boundary_val)._M_string_length;
    if (local_78 < 0xd) {
      local_6c = 0;
      uStack_74 = 0;
      uStack_70 = 0;
      if (local_78 == 0) {
        __src = (pointer)0x0;
      }
      else {
        switchD_012b9b0d::default(&uStack_74,__src,(ulong)(local_78 & 0xf));
        __src = (pointer)CONCAT44(local_6c,uStack_70);
      }
    }
    else {
      uStack_74 = *(undefined4 *)__src;
    }
    sort_key.value.pointer.ptr = (char *)&this->boundary_values;
    sort_key.value._0_8_ = __src;
    CreateSortKeyHelpers::DecodeSortKey
              ((CreateSortKeyHelpers *)CONCAT44(uStack_74,local_78),sort_key,(DataChunk *)0x0,
               (idx_t)&this->modifiers,in_R9);
    pVVar2 = (this->boundary_values).data.
             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_03 = (this->boundary_values).data.
                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start; this_03 != pVVar2; this_03 = this_03 + 1) {
      Vector::SetVectorType(this_03,CONSTANT_VECTOR);
    }
  }
  count = sort_chunk->count;
  (this->boundary_values).count = count;
  local_98.sel_vector = (sel_t *)0x0;
  local_98.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_98.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((this->orders->
      super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
      super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->orders->
      super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
      super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    bVar10 = false;
  }
  else {
    this_00 = &this->boundary_values;
    this_01 = &this->compare_chunk;
    true_sel = &this->true_sel;
    false_sel = &this->false_sel;
    local_58.ptr = &this->new_remaining_sel;
    local_60 = &(this->new_remaining_sel).selection_data;
    local_a0 = 0;
    __n = 0;
    do {
      if (local_98.sel_vector == (sel_t *)0x0) {
        pvVar6 = vector<duckdb::Vector,_true>::operator[](&this_01->data,__n);
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&sort_chunk->data,__n);
        Vector::Reference(pvVar6,pvVar7);
      }
      else {
        pvVar6 = vector<duckdb::Vector,_true>::operator[](&this_01->data,__n);
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&sort_chunk->data,__n);
        Vector::Slice(pvVar6,pvVar7,&local_98,count);
      }
      this_02 = this->orders;
      pBVar3 = (this_02->
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pBVar4 = (this_02->
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar8 = vector<duckdb::BoundOrderByNode,_true>::operator[](this_02,__n);
      if (pvVar8->null_order == NULLS_LAST) {
        pvVar8 = vector<duckdb::BoundOrderByNode,_true>::operator[](this->orders,__n);
        if (pvVar8->type == ASCENDING) {
          pvVar6 = vector<duckdb::Vector,_true>::operator[](&this_01->data,__n);
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
          iVar9 = VectorOperations::DistinctLessThan
                            (pvVar6,pvVar7,&local_98,count,
                             (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                             (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
        else {
          pvVar6 = vector<duckdb::Vector,_true>::operator[](&this_01->data,__n);
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
          iVar9 = VectorOperations::DistinctGreaterThanNullsFirst
                            (pvVar6,pvVar7,&local_98,count,
                             (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                             (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
      }
      else {
        pvVar8 = vector<duckdb::BoundOrderByNode,_true>::operator[](this->orders,__n);
        if (pvVar8->type == ASCENDING) {
          pvVar6 = vector<duckdb::Vector,_true>::operator[](&this_01->data,__n);
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
          iVar9 = VectorOperations::DistinctLessThanNullsFirst
                            (pvVar6,pvVar7,&local_98,count,
                             (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                             (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
        else {
          pvVar6 = vector<duckdb::Vector,_true>::operator[](&this_01->data,__n);
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
          iVar9 = VectorOperations::DistinctGreaterThan
                            (pvVar6,pvVar7,&local_98,count,
                             (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                             (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
      }
      if (iVar9 != 0) {
        switchD_012b9b0d::default
                  ((this->final_sel).sel_vector + local_a0,(this->true_sel).sel_vector,iVar9 * 4);
        local_a0 = local_a0 + iVar9;
      }
      uVar1 = __n + 1;
      if ((uVar1 == ((long)pBVar3 - (long)pBVar4 >> 3) * -0x5555555555555555) || (count == iVar9))
      break;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&this_01->data,__n);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&sort_chunk->data,__n);
      Vector::Slice(pvVar6,pvVar7,false_sel,count - iVar9);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&this_01->data,__n);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
      count = VectorOperations::NotDistinctFrom
                        (pvVar6,pvVar7,(optional_ptr<const_duckdb::SelectionVector,_true>)false_sel,
                         count - iVar9,local_58,(optional_ptr<duckdb::SelectionVector,_true>)0x0);
      shared_ptr<duckdb::SelectionData,_true>::operator=(&local_98.selection_data,local_60);
      local_98.sel_vector = (this->new_remaining_sel).sel_vector;
      __n = uVar1;
    } while (uVar1 < (ulong)(((long)(this->orders->
                                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                    ).
                                    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->orders->
                                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                    ).
                                    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
    bVar10 = local_a0 != 0;
    if ((bVar10) && (local_a0 < sort_chunk->count)) {
      DataChunk::Slice(sort_chunk,&this->final_sel,local_a0);
      DataChunk::Slice(local_68,&this->final_sel,local_a0);
    }
  }
  if (local_98.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
LAB_0155d463:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar10;
}

Assistant:

bool TopNHeap::CheckBoundaryValues(DataChunk &sort_chunk, DataChunk &payload, TopNBoundaryValue &global_boundary) {
	// get the global boundary value
	auto current_boundary_val = global_boundary.GetBoundaryValue();
	if (current_boundary_val.empty()) {
		// no boundary value (yet) - don't do anything
		return true;
	}
	if (current_boundary_val != boundary_val) {
		// new boundary value - decode
		boundary_val = std::move(current_boundary_val);
		boundary_values.Reset();
		CreateSortKeyHelpers::DecodeSortKey(string_t(boundary_val), boundary_values, 0, modifiers);
		for (auto &col : boundary_values.data) {
			col.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
	}
	boundary_values.SetCardinality(sort_chunk.size());

	// we have boundary values
	// from these boundary values, determine which values we should insert (if any)
	idx_t final_count = 0;

	SelectionVector remaining_sel(nullptr);
	idx_t remaining_count = sort_chunk.size();
	for (idx_t i = 0; i < orders.size(); i++) {
		if (remaining_sel.data()) {
			compare_chunk.data[i].Slice(sort_chunk.data[i], remaining_sel, remaining_count);
		} else {
			compare_chunk.data[i].Reference(sort_chunk.data[i]);
		}
		bool is_last = i + 1 == orders.size();
		idx_t true_count;
		if (orders[i].null_order == OrderByNullType::NULLS_LAST) {
			if (orders[i].type == OrderType::ASCENDING) {
				true_count = VectorOperations::DistinctLessThan(compare_chunk.data[i], boundary_values.data[i],
				                                                &remaining_sel, remaining_count, &true_sel, &false_sel);
			} else {
				true_count = VectorOperations::DistinctGreaterThanNullsFirst(compare_chunk.data[i],
				                                                             boundary_values.data[i], &remaining_sel,
				                                                             remaining_count, &true_sel, &false_sel);
			}
		} else {
			D_ASSERT(orders[i].null_order == OrderByNullType::NULLS_FIRST);
			if (orders[i].type == OrderType::ASCENDING) {
				true_count = VectorOperations::DistinctLessThanNullsFirst(compare_chunk.data[i],
				                                                          boundary_values.data[i], &remaining_sel,
				                                                          remaining_count, &true_sel, &false_sel);
			} else {
				true_count =
				    VectorOperations::DistinctGreaterThan(compare_chunk.data[i], boundary_values.data[i],
				                                          &remaining_sel, remaining_count, &true_sel, &false_sel);
			}
		}

		if (true_count > 0) {
			memcpy(final_sel.data() + final_count, true_sel.data(), true_count * sizeof(sel_t));
			final_count += true_count;
		}
		idx_t false_count = remaining_count - true_count;
		if (!is_last && false_count > 0) {
			// check what we should continue to check
			compare_chunk.data[i].Slice(sort_chunk.data[i], false_sel, false_count);
			remaining_count = VectorOperations::NotDistinctFrom(compare_chunk.data[i], boundary_values.data[i],
			                                                    &false_sel, false_count, &new_remaining_sel, nullptr);
			remaining_sel.Initialize(new_remaining_sel);
		} else {
			break;
		}
	}
	if (final_count == 0) {
		return false;
	}
	if (final_count < sort_chunk.size()) {
		sort_chunk.Slice(final_sel, final_count);
		payload.Slice(final_sel, final_count);
	}
	return true;
}